

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O1

string_view __thiscall csv::CSVRow::get_field(CSVRow *this,size_t index)

{
  element_type *peVar1;
  RawCSVField *pRVar2;
  mapped_type *pmVar3;
  runtime_error *this_00;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pcVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  string_view sVar11;
  size_t field_index;
  size_t local_38;
  
  if (this->row_length <= index) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Index out of bounds.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_38 = index + this->fields_start;
  peVar1 = (this->data).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pRVar2 = internals::CSVFieldList::operator[](&peVar1->fields,local_38);
  uVar10 = (peVar1->data)._M_len;
  uVar6 = pRVar2->start + this->data_start;
  uVar5 = uVar10 - uVar6;
  if (uVar6 <= uVar10) {
    pcVar7 = (peVar1->data)._M_str + uVar6;
    if (pRVar2->has_double_quote == true) {
      pmVar3 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&peVar1->double_quote_fields,&local_38);
      if ((pmVar3->_M_string_length == 0) && (pRVar2->length != 0)) {
        uVar10 = 0;
        bVar8 = false;
        do {
          bVar9 = bVar8;
          if (((((this->data).
                 super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->parse_flags)._M_elems[(int)pcVar7[uVar10] + 0x80] == QUOTE) &&
             (bVar9 = true, bVar8)) {
            bVar8 = false;
          }
          else {
            std::__cxx11::string::push_back((char)pmVar3);
            bVar8 = bVar9;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < pRVar2->length);
      }
      pcVar7 = (pmVar3->_M_dataplus)._M_p;
      uVar10 = pmVar3->_M_string_length;
    }
    else {
      uVar10 = pRVar2->length;
      if (uVar5 < pRVar2->length) {
        uVar10 = uVar5;
      }
    }
    sVar11._M_str = pcVar7;
    sVar11._M_len = uVar10;
    return sVar11;
  }
  uVar4 = std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     uVar6);
  __cxa_free_exception(uVar6);
  _Unwind_Resume(uVar4);
}

Assistant:

CSV_INLINE csv::string_view CSVRow::get_field(size_t index) const
    {
        using internals::ParseFlags;

        if (index >= this->size())
            throw std::runtime_error("Index out of bounds.");

        const size_t field_index = this->fields_start + index;
        auto& field = this->data->fields[field_index];
        auto field_str = csv::string_view(this->data->data).substr(this->data_start + field.start);

        if (field.has_double_quote) {
            auto& value = this->data->double_quote_fields[field_index];
            if (value.empty()) {
                bool prev_ch_quote = false;
                for (size_t i = 0; i < field.length; i++) {
                    if (this->data->parse_flags[field_str[i] + 128] == ParseFlags::QUOTE) {
                        if (prev_ch_quote) {
                            prev_ch_quote = false;
                            continue;
                        }
                        else {
                            prev_ch_quote = true;
                        }
                    }

                    value += field_str[i];
                }
            }

            return csv::string_view(value);
        }

        return field_str.substr(0, field.length);
    }